

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  string local_350;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  undefined1 local_2b0 [8];
  string fwSearchFlag;
  cmAlphaNum local_270;
  cmAlphaNum local_240;
  string local_210;
  string local_1f0 [8];
  string stdLibString;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  cmValue local_148;
  cmValue value_1;
  string libPathTerminator;
  string local_118;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmValue local_88;
  cmValue value;
  string libPathFlag;
  string linkLanguage;
  cmComputeLinkInformation *cli;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkPath_local;
  string *frameworkPath_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkLibraries_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmComputeLinkInformation *pcli_local;
  cmLocalGenerator *this_local;
  
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&libPathFlag.field_2 + 8),pcli);
  std::__cxx11::string::string((string *)&value);
  pcVar1 = this->Makefile;
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_(&local_e8,pcli);
  std::operator+(&local_c8,"CMAKE_",&local_e8);
  std::operator+(&local_a8,&local_c8,"_LIBRARY_PATH_FLAG");
  local_88 = cmMakefile::GetDefinition(pcVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  bVar2 = cmValue::operator_cast_to_bool(&local_88);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_88);
    std::__cxx11::string::operator=((string *)&value,(string *)psVar3);
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_LIBRARY_PATH_FLAG",
               (allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_118);
    std::__cxx11::string::operator=((string *)&value,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator
              ((allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::string((string *)&value_1);
  pcVar1 = this->Makefile;
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_(&local_1a8,pcli);
  std::operator+(&local_188,"CMAKE_",&local_1a8);
  std::operator+(&local_168,&local_188,"_LIBRARY_PATH_TERMINATOR");
  local_148 = cmMakefile::GetDefinition(pcVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  bVar2 = cmValue::operator_cast_to_bool(&local_148);
  if (bVar2) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_148);
    std::__cxx11::string::operator=((string *)&value_1,(string *)psVar3);
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"CMAKE_LIBRARY_PATH_TERMINATOR",
               (allocator<char> *)(stdLibString.field_2._M_local_buf + 0xf));
    psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_1c8);
    std::__cxx11::string::operator=((string *)&value_1,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)(stdLibString.field_2._M_local_buf + 0xf));
  }
  pcVar1 = this->Makefile;
  cmAlphaNum::cmAlphaNum(&local_240,"CMAKE_");
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&fwSearchFlag.field_2 + 8),pcli);
  cmAlphaNum::cmAlphaNum(&local_270,(string *)((long)&fwSearchFlag.field_2 + 8));
  cmStrCat<char[20]>(&local_210,&local_240,&local_270,(char (*) [20])"_STANDARD_LIBRARIES");
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_210);
  std::__cxx11::string::string(local_1f0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)(fwSearchFlag.field_2._M_local_buf + 8));
  pcVar1 = this->Makefile;
  cmAlphaNum::cmAlphaNum(&local_300,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_330,(string *)((long)&libPathFlag.field_2 + 8));
  cmStrCat<char[23]>(&local_2d0,&local_300,&local_330,(char (*) [23])0xdee0e3);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_2d0);
  std::__cxx11::string::string((string *)local_2b0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_2d0);
  cmLinkLineComputer::ComputeFrameworkPath(&local_350,linkLineComputer,pcli,(string *)local_2b0);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  cmLinkLineComputer::ComputeLinkPath
            (linkLineComputer,pcli,(string *)&value,(string *)&value_1,linkPath);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(linkLineComputer,pcli,local_1f0,linkLibraries);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)&value_1);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)(libPathFlag.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::vector<BT<std::string>>& linkLibraries, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_FLAG")) {
    libPathFlag = *value;
  } else {
    libPathFlag =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  }

  std::string libPathTerminator;
  if (cmValue value = this->Makefile->GetDefinition(
        "CMAKE_" + cli.GetLinkLanguage() + "_LIBRARY_PATH_TERMINATOR")) {
    libPathTerminator = *value;
  } else {
    libPathTerminator =
      this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");
  }

  // Add standard libraries for this language.
  std::string stdLibString = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", cli.GetLinkLanguage(), "_STANDARD_LIBRARIES"));

  // Append the framework search path flags.
  std::string fwSearchFlag = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_FRAMEWORK_SEARCH_FLAG"));

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator,
                                    linkPath);
  linkLineComputer->ComputeLinkLibraries(cli, stdLibString, linkLibraries);
}